

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

void write_crl(scep *s)

{
  int iVar1;
  OPENSSL_STACK *pOVar2;
  X509_CRL *x;
  FILE *fp_00;
  FILE *fp;
  X509_CRL *crl;
  stack_st_X509_CRL *crls;
  PKCS7 *p7;
  scep *s_local;
  
  pOVar2 = ossl_check_const_X509_CRL_sk_type(((s->reply_p7->d).sign)->crl);
  x = (X509_CRL *)OPENSSL_sk_value(pOVar2,0);
  if (x == (X509_CRL *)0x0) {
    fprintf(_stderr,"%s: cannot find CRL in reply\n",pname);
    exit(0x5d);
  }
  fp_00 = fopen(w_char,"w");
  if (fp_00 == (FILE *)0x0) {
    fprintf(_stderr,"%s: cannot open CRL file for writing\n",pname);
    exit(0x5d);
  }
  if (v_flag != 0) {
    printf("%s: writing CRL\n",pname);
  }
  if (d_flag != 0) {
    PEM_write_X509_CRL(_stdout,x);
  }
  iVar1 = PEM_write_X509_CRL(fp_00,x);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s: error while writing CRL file\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x5d);
  }
  printf("%s: CRL written as %s\n",pname,w_char);
  fclose(fp_00);
  return;
}

Assistant:

void
write_crl(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509_CRL)	*crls;
	X509_CRL		*crl;	
	FILE			*fp;

	/* Get CRL */
	p7 = s->reply_p7;
	crls = p7->d.sign->crl;
	
	/* We expect only one CRL: */
	crl = sk_X509_CRL_value(crls, 0);
	if (crl == NULL) {
		fprintf(stderr, "%s: cannot find CRL in reply\n", pname);
		exit (SCEP_PKISTATUS_FILE);
	}

	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, w_char, "w")))
#else
	if (!(fp = fopen(w_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open CRL file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: writing CRL\n", pname);
	if (d_flag)
		PEM_write_X509_CRL(stdout, crl);
	if (PEM_write_X509_CRL(fp, crl) != 1) {
		fprintf(stderr, "%s: error while writing CRL "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	printf("%s: CRL written as %s\n", pname, w_char);
	(void)fclose(fp);
}